

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool chaiscript::dispatch::Proxy_Function_Base::compare_type_to_param
               (Type_Info *ti,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Type_Info *pTVar2;
  Type_Conversions *this;
  undefined1 local_70 [8];
  Type_Info function_ti;
  Type_Info boxed_number_ti;
  Type_Info boxed_value_ti;
  Type_Conversions_State *t_conversions_local;
  Boxed_Value *bv_local;
  Type_Info *ti_local;
  
  user_type<chaiscript::Boxed_Value>();
  user_type<chaiscript::Boxed_Number>();
  user_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>();
  bVar1 = Type_Info::is_undef(ti);
  if ((!bVar1) && (bVar1 = Type_Info::bare_equal(ti,(Type_Info *)&boxed_number_ti.m_flags), !bVar1))
  {
    pTVar2 = Boxed_Value::get_type_info(bv);
    bVar1 = Type_Info::is_undef(pTVar2);
    if (bVar1) {
      return false;
    }
    bVar1 = Type_Info::bare_equal(ti,(Type_Info *)&function_ti.m_flags);
    if (bVar1) {
      pTVar2 = Boxed_Value::get_type_info(bv);
      bVar1 = Type_Info::is_arithmetic(pTVar2);
      if (bVar1) {
        return true;
      }
    }
    pTVar2 = Boxed_Value::get_type_info(bv);
    bVar1 = Type_Info::bare_equal(ti,pTVar2);
    if (!bVar1) {
      pTVar2 = Boxed_Value::get_type_info(bv);
      bVar1 = Type_Info::bare_equal(pTVar2,(Type_Info *)local_70);
      if (!bVar1) {
        this = Type_Conversions_State::operator->(t_conversions);
        pTVar2 = Boxed_Value::get_type_info(bv);
        bVar1 = Type_Conversions::converts(this,ti,pTVar2);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

static bool compare_type_to_param(const Type_Info &ti, const Boxed_Value &bv, const Type_Conversions_State &t_conversions) noexcept {
        const auto boxed_value_ti = user_type<Boxed_Value>();
        const auto boxed_number_ti = user_type<Boxed_Number>();
        const auto function_ti = user_type<std::shared_ptr<const Proxy_Function_Base>>();

        if (ti.is_undef() || ti.bare_equal(boxed_value_ti)
            || (!bv.get_type_info().is_undef()
                && ((ti.bare_equal(boxed_number_ti) && bv.get_type_info().is_arithmetic()) || ti.bare_equal(bv.get_type_info())
                    || bv.get_type_info().bare_equal(function_ti) || t_conversions->converts(ti, bv.get_type_info())))) {
          return true;
        } else {
          return false;
        }
      }